

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O0

void __thiscall pbrt::CheckCallbackScope::~CheckCallbackScope(CheckCallbackScope *this)

{
  size_type sVar1;
  char (*in_stack_00000018) [2];
  char (*in_stack_00000020) [17];
  int vb;
  size_type va;
  char *in_stack_00000038;
  LogLevel in_stack_00000044;
  char (*in_stack_00000050) [17];
  unsigned_long *in_stack_00000058;
  char (*in_stack_00000060) [2];
  int *in_stack_00000068;
  
  sVar1 = std::
          vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
          ::size((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
                  *)callbacks_abi_cxx11_);
  if (sVar1 == 0) {
    LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],unsigned_long&,char_const(&)[2],int&>
              (in_stack_00000044,in_stack_00000038,this._4_4_,(char *)va,in_stack_00000020,
               in_stack_00000018,in_stack_00000050,in_stack_00000058,in_stack_00000060,
               in_stack_00000068);
  }
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
  ::pop_back((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
              *)0x854aba);
  return;
}

Assistant:

CheckCallbackScope::~CheckCallbackScope() {
    CHECK_GT(callbacks.size(), 0);
    callbacks.pop_back();
}